

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O3

ChQuaternion<double> *
chrono::ImmQ_complete(ChQuaternion<double> *__return_storage_ptr__,ChVector<double> *qimm)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar1 = *(undefined1 (*) [16])qimm->m_data;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = qimm->m_data[1];
  *(undefined1 (*) [16])(__return_storage_ptr__->m_data + 1) = auVar1;
  auVar1 = vfnmadd213sd_fma(auVar1,auVar1,ZEXT816(0x3ff0000000000000));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = qimm->m_data[2];
  __return_storage_ptr__->m_data[3] = qimm->m_data[2];
  auVar1 = vfnmadd231sd_fma(auVar1,auVar3,auVar3);
  auVar1 = vfnmadd231sd_fma(auVar1,auVar4,auVar4);
  if (auVar1._0_8_ < 0.0) {
    dVar2 = sqrt(auVar1._0_8_);
  }
  else {
    auVar1 = vsqrtsd_avx(auVar1,auVar1);
    dVar2 = auVar1._0_8_;
  }
  __return_storage_ptr__->m_data[0] = dVar2;
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> ImmQ_complete(const ChVector<double>& qimm) {
    ChQuaternion<double> mq;
    mq.e1() = qimm.x();
    mq.e2() = qimm.y();
    mq.e3() = qimm.z();
    mq.e0() = sqrt(1 - mq.e1() * mq.e1() - mq.e2() * mq.e2() - mq.e3() * mq.e3());
    return mq;
}